

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O3

void __thiscall
iDynTree::AttitudeQuaternionEKF::serializeMeasurementVector(AttitudeQuaternionEKF *this)

{
  double dVar1;
  size_t sVar2;
  double *pdVar3;
  
  sVar2 = iDynTree::VectorDynSize::size();
  if (sVar2 != this->m_output_size) {
    iDynTree::VectorDynSize::resize((ulong)&this->m_y);
  }
  pdVar3 = (double *)iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  dVar1 = (this->m_Acc_y).m_data[1];
  *pdVar3 = (this->m_Acc_y).m_data[0];
  pdVar3[1] = dVar1;
  pdVar3[2] = (this->m_Acc_y).m_data[2];
  if ((this->m_params_qekf).use_magnetometer_measurements == true) {
    dVar1 = this->m_Mag_y;
    pdVar3 = (double *)iDynTree::VectorDynSize::operator()(&this->m_y,3);
    *pdVar3 = dVar1;
  }
  return;
}

Assistant:

void iDynTree::AttitudeQuaternionEKF::serializeMeasurementVector()
{
    using iDynTree::toEigen;
    if (m_y.size() != m_output_size)
    {
        m_y.resize(m_output_size);
    }

    toEigen(m_y).block<3, 1>(0, 0) = toEigen(m_Acc_y);
    if (m_params_qekf.use_magnetometer_measurements)
    {
        m_y(3) = m_Mag_y;
    }
}